

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

char * uv__cgroup1_find_memory_controller(char *buf,int *n)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = strchr(buf,0x3a);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    while (iVar1 = strncmp(pcVar2,":memory:",8), iVar1 != 0) {
      pcVar2 = strchr(pcVar2,10);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar2 = strchr(pcVar2,0x3a);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    pcVar2 = pcVar2 + 9;
    sVar3 = strcspn(pcVar2,"\n");
    *n = (int)sVar3;
  }
  return pcVar2;
}

Assistant:

static char* uv__cgroup1_find_memory_controller(char buf[static 1024],
                                                int* n) {
  char* p;

  /* Seek to the memory controller line. */
  p = strchr(buf, ':');
  while (p != NULL && strncmp(p, ":memory:", 8)) {
    p = strchr(p, '\n');
    if (p != NULL)
      p = strchr(p, ':');
  }

  if (p != NULL) {
    /* Determine the length of the mount path. */
    p = p + strlen(":memory:/");
    *n = (int) strcspn(p, "\n");
  }

  return p;
}